

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

void __thiscall QProxyStylePrivate::ensureBaseStyle(QProxyStylePrivate *this)

{
  long lVar1;
  QLatin1StringView latin1;
  bool bVar2;
  int iVar3;
  QProxyStyle *pQVar4;
  QStyle *pQVar5;
  char *pcVar6;
  QObject *pQVar7;
  QProxyStylePrivate *in_RDI;
  long in_FS_OFFSET;
  QProxyStyle *q;
  QStyle *in_stack_ffffffffffffff88;
  QStyle *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  QProxyStylePrivate *pQVar8;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = in_RDI;
  pQVar4 = q_func(in_RDI);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QStyle> *)0x4089f0);
  if (!bVar2) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QStyle> *)0x408a0c);
    if ((!bVar2) && (bVar2 = QString::isEmpty((QString *)0x408a20), !bVar2)) {
      QStyleFactory::create((QString *)in_RDI);
      QPointer<QStyle>::operator=
                ((QPointer<QStyle> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QStyle> *)0x408a59);
      if (bVar2) {
        pQVar5 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x408a73);
        (*(code *)**(undefined8 **)pQVar5)();
        in_stack_ffffffffffffff98 = (char *)QMetaObject::className();
        (*(code *)**(undefined8 **)&(pQVar4->super_QCommonStyle).super_QStyle)();
        pcVar6 = (char *)QMetaObject::className();
        iVar3 = qstrcmp(in_stack_ffffffffffffff98,pcVar6);
        if (iVar3 == 0) {
          in_stack_ffffffffffffff90 =
               ::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x408abd);
          if (in_stack_ffffffffffffff90 != (QStyle *)0x0) {
            (**(code **)(*(long *)in_stack_ffffffffffffff90 + 0x20))();
          }
          QPointer<QStyle>::operator=
                    ((QPointer<QStyle> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
      }
    }
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QStyle> *)0x408afd);
    if (!bVar2) {
      QApplicationPrivate::desktopStyleKey();
      QStyleFactory::create((QString *)in_RDI);
      QPointer<QStyle>::operator=
                ((QPointer<QStyle> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      QString::~QString((QString *)0x408b33);
    }
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QStyle> *)0x408b44);
    if (!bVar2) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
      latin1.m_data = in_stack_ffffffffffffffc8;
      latin1.m_size = (qsizetype)pQVar8;
      QString::QString((QString *)in_RDI,latin1);
      QStyleFactory::create((QString *)in_RDI);
      QPointer<QStyle>::operator=
                ((QPointer<QStyle> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      QString::~QString((QString *)0x408b9f);
    }
    QPointer<QStyle>::operator->((QPointer<QStyle> *)0x408bb0);
    QStyle::setProxy(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    pQVar7 = &QPointer<QStyle>::operator->((QPointer<QStyle> *)0x408bce)->super_QObject;
    QObject::setParent(pQVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProxyStylePrivate::ensureBaseStyle() const
{
    Q_Q(const QProxyStyle);

    if (baseStyle)
        return;

    if (!baseStyle && !QApplicationPrivate::styleOverride.isEmpty()) {
        baseStyle = QStyleFactory::create(QApplicationPrivate::styleOverride);
        if (baseStyle) {
            // If baseStyle is an instance of the same proxyStyle
            // we destroy it and fall back to the desktop style
            if (qstrcmp(baseStyle->metaObject()->className(),
                        q->metaObject()->className()) == 0) {
                delete baseStyle;
                baseStyle = nullptr;
            }
        }
    }

    if (!baseStyle) // Use application desktop style
        baseStyle = QStyleFactory::create(QApplicationPrivate::desktopStyleKey());

    if (!baseStyle) // Fallback to windows style
        baseStyle = QStyleFactory::create("windows"_L1);

    baseStyle->setProxy(const_cast<QProxyStyle*>(q));
    baseStyle->setParent(const_cast<QProxyStyle*>(q)); // Take ownership
}